

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O1

void foo3(int *a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  
  iVar2 = std::uncaught_exceptions();
  iVar1 = *a;
  *a = 3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo3 a = ",9);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (iVar2 != -1) {
    iVar3 = std::uncaught_exceptions();
    if (iVar3 <= iVar2) {
      *a = iVar1;
    }
  }
  return;
}

Assistant:

void foo3(int& a) {
#if defined(__cpp_deduction_guides) && __cpp_deduction_guides >= 201611L
  nstd::saver_success state_saver{a}; // Custom state saver on success, without macros.
#else
  nstd::saver_success<decltype(a)> state_saver{a}; // Custom state saver on success, without macros.
#endif
  a = 3;
  std::cout << "foo3 a = " << a << std::endl;
  // Original state will automatically restored, on scope leave when no exceptions have been thrown.
}